

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O2

REF_STATUS ref_agents_tattle(REF_AGENTS ref_agents,REF_INT id,char *context)

{
  REF_AGENT_STRUCT *pRVar1;
  long lVar2;
  
  pRVar1 = ref_agents->agent;
  lVar2 = (long)id;
  printf("%d: %d id %d mode %d home %d node %d part %d seed %ld global %f %f %f %s\n",
         pRVar1[lVar2].xyz[1],SUB84(pRVar1[lVar2].xyz[1],0),pRVar1[lVar2].xyz[2],
         (ulong)(uint)ref_agents->ref_mpi->id,lVar2,(ulong)pRVar1[lVar2].mode,
         (ulong)(uint)pRVar1[lVar2].home,(ulong)(uint)pRVar1[lVar2].node,
         (ulong)(uint)pRVar1[lVar2].part,(ulong)(uint)pRVar1[lVar2].seed,pRVar1[lVar2].global,
         context);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_agents_tattle(REF_AGENTS ref_agents, REF_INT id,
                                     const char *context) {
  printf("%d: %d id %d mode %d home %d node %d part %d seed " REF_GLOB_FMT
         " global %f %f %f "
         "%s\n",
         ref_mpi_rank(ref_agents->ref_mpi), id,
         (int)ref_agent_mode(ref_agents, id), ref_agent_home(ref_agents, id),
         ref_agent_node(ref_agents, id), ref_agent_part(ref_agents, id),
         ref_agent_seed(ref_agents, id), ref_agent_global(ref_agents, id),
         ref_agent_xyz(ref_agents, 1, id), ref_agent_xyz(ref_agents, 1, id),
         ref_agent_xyz(ref_agents, 2, id), context);
  return REF_SUCCESS;
}